

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O3

int Saig_SynchSavePattern
              (Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,int iPat,Vec_Str_t *vSequence)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  size_t __size;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  long lVar16;
  
  if (nWords * 0x10 <= iPat) {
    __assert_fail("iPat < 16 * nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                  ,0x147,
                  "int Saig_SynchSavePattern(Aig_Man_t *, Vec_Ptr_t *, int, int, Vec_Str_t *)");
  }
  if (0 < pAig->nTruePis) {
    lVar9 = 0;
    do {
      if (pAig->vCis->nSize <= lVar9) goto LAB_006f87a2;
      iVar14 = *(int *)((long)pAig->vCis->pArray[lVar9] + 0x24);
      if (((long)iVar14 < 0) || (vSimInfo->nSize <= iVar14)) goto LAB_006f87a2;
      uVar10 = *(uint *)((long)vSimInfo->pArray[iVar14] + (long)(iPat >> 4) * 4);
      uVar12 = vSequence->nSize;
      if (uVar12 == vSequence->nCap) {
        if ((int)uVar12 < 0x10) {
          if (vSequence->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(vSequence->pArray,0x10);
          }
          vSequence->pArray = pcVar7;
          vSequence->nCap = 0x10;
        }
        else {
          __size = (ulong)uVar12 * 2;
          if (vSequence->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(__size);
          }
          else {
            pcVar7 = (char *)realloc(vSequence->pArray,__size);
          }
          vSequence->pArray = pcVar7;
          vSequence->nCap = (int)__size;
        }
      }
      else {
        pcVar7 = vSequence->pArray;
      }
      iVar14 = vSequence->nSize;
      vSequence->nSize = iVar14 + 1;
      pcVar7[iVar14] = (byte)(uVar10 >> ((char)iPat * '\x02' & 0x1eU)) & 3;
      lVar9 = lVar9 + 1;
    } while (lVar9 < pAig->nTruePis);
  }
  auVar5 = _DAT_0093e4e0;
  auVar4 = _DAT_0093d220;
  auVar3 = _DAT_0093d210;
  iVar14 = pAig->nRegs;
  if (iVar14 < 1) {
    iVar6 = 0;
  }
  else {
    pVVar1 = pAig->vCos;
    lVar9 = (ulong)(uint)nWords - 1;
    auVar13._8_4_ = (int)lVar9;
    auVar13._0_8_ = lVar9;
    auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
    iVar11 = 0;
    auVar13 = auVar13 ^ _DAT_0093d220;
    iVar6 = 0;
    do {
      uVar10 = pAig->nTruePos + iVar11;
      if (((((int)uVar10 < 0) || (pVVar1->nSize <= (int)uVar10)) ||
          (uVar12 = pAig->nTruePis + iVar11, (int)uVar12 < 0)) || (pAig->vCis->nSize <= (int)uVar12)
         ) {
LAB_006f87a2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar19 = *(int *)((long)pVVar1->pArray[uVar10] + 0x24);
      if (((long)iVar19 < 0) || (vSimInfo->nSize <= iVar19)) goto LAB_006f87a2;
      uVar8 = *(uint *)((long)vSimInfo->pArray[iVar19] + (long)(iPat >> 4) * 4) >>
              ((char)iPat * '\x02' & 0x1eU) & 3;
      uVar10 = *(uint *)((long)pAig->vCis->pArray[uVar12] + 0x24);
      if (((long)(int)uVar10 < 0) || ((uint)vSimInfo->nSize <= uVar10)) goto LAB_006f87a2;
      if (0 < nWords) {
        if (uVar8 == 2) {
          __assert_fail("v == 0 || v == 1 || v == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                        ,0x37,"unsigned int Saig_SynchTernary(int)");
        }
        uVar12 = -(uint)(uVar8 != 1) | 0x55555555;
        if (uVar8 == 0) {
          uVar12 = 0;
        }
        pvVar2 = vSimInfo->pArray[(int)uVar10];
        lVar9 = 0;
        auVar15 = auVar3;
        auVar17 = auVar5;
        do {
          auVar18 = auVar15 ^ auVar4;
          iVar14 = auVar13._4_4_;
          if ((bool)(~(auVar18._4_4_ == iVar14 && auVar13._0_4_ < auVar18._0_4_ ||
                      iVar14 < auVar18._4_4_) & 1)) {
            *(uint *)((long)pvVar2 + lVar9) = uVar12;
          }
          if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
              auVar18._12_4_ <= auVar13._12_4_) {
            *(uint *)((long)pvVar2 + lVar9 + 4) = uVar12;
          }
          auVar18 = auVar17 ^ auVar4;
          iVar19 = auVar18._4_4_;
          if (iVar19 <= iVar14 && (iVar19 != iVar14 || auVar18._0_4_ <= auVar13._0_4_)) {
            *(uint *)((long)pvVar2 + lVar9 + 8) = uVar12;
            *(uint *)((long)pvVar2 + lVar9 + 0xc) = uVar12;
          }
          lVar16 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 4;
          auVar15._8_8_ = lVar16 + 4;
          lVar16 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 4;
          auVar17._8_8_ = lVar16 + 4;
          lVar9 = lVar9 + 0x10;
        } while ((ulong)(nWords + 3U >> 2) << 4 != lVar9);
        iVar14 = pAig->nRegs;
      }
      iVar6 = iVar6 + (uint)(uVar8 == 3);
      iVar11 = iVar11 + 1;
    } while (iVar11 < iVar14);
  }
  return iVar6;
}

Assistant:

int Saig_SynchSavePattern( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, int iPat, Vec_Str_t * vSequence )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    unsigned * pSim;
    int Counter, Value, i, w;
    assert( iPat < 16 * nWords );
    Saig_ManForEachPi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        Value = (pSim[iPat>>4] >> ((iPat&0xf) << 1)) & 3;
        Vec_StrPush( vSequence, (char)Value );
//        printf( "%d ", Value );
    }
//    printf( "\n" );
    Counter = 0;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLi->Id );
        Value = (pSim[iPat>>4] >> ((iPat&0xf) << 1)) & 3;
        Counter += (Value == 3);
        // save patern in the same register
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLo->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( Value );
    }
    return Counter;
}